

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_multi_prefix_op_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Value *pVVar4;
  Type *pTVar5;
  Builder *this;
  Operation *op_00;
  Operation *is_helper_lane;
  Id ballot_value;
  uint i;
  Id ballot [4];
  Operation *pOStack_48;
  Id call_id;
  Operation *op;
  Id type_id;
  HelperCall HStack_30;
  bool fp;
  Op partitioned_op;
  HelperCall helper_call;
  uint32_t op_kind;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  _helper_call = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand((Instruction *)builder,6,&partitioned_op);
  if (bVar2) {
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    pTVar5 = LLVMBC::Value::getType(pVVar4);
    bVar2 = LLVMBC::Type::isIntegerTy(pTVar5);
    pCVar1 = instruction_local;
    bVar2 = !bVar2;
    switch((undefined1)partitioned_op) {
    case 0:
      HStack_30 = WaveMultiPrefixIAdd;
      if (bVar2) {
        HStack_30 = WaveMultiPrefixFAdd;
      }
      type_id = 0x15d;
      if (bVar2) {
        type_id = 0x15e;
      }
      break;
    case 1:
      HStack_30 = WaveMultiPrefixBitAnd;
      type_id = 0x167;
      break;
    case 2:
      HStack_30 = WaveMultiPrefixBitOr;
      type_id = 0x168;
      break;
    case 3:
      HStack_30 = WaveMultiPrefixBitXor;
      type_id = 0x169;
      break;
    case 4:
      HStack_30 = WaveMultiPrefixIMul;
      if (bVar2) {
        HStack_30 = WaveMultiPrefixFMul;
      }
      type_id = 0x15f;
      if (bVar2) {
        type_id = 0x160;
      }
      break;
    default:
      return false;
    }
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    pTVar5 = LLVMBC::Value::getType(pVVar4);
    IVar3 = Converter::Impl::get_type_id((Impl *)pCVar1,pTVar5,0);
    if (((ulong)instruction_local[0x19].super_Instruction.operands.
                super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) == 0) {
      IVar3 = SPIRVModule::get_helper_call_id
                        ((SPIRVModule *)(instruction_local->super_Instruction).super_Value.tween_id,
                         HStack_30,IVar3);
      pOStack_48 = Converter::Impl::allocate
                             ((Impl *)instruction_local,OpFunctionCall,(Value *)builder);
      Operation::add_id(pOStack_48,IVar3);
    }
    else {
      spv::Builder::addExtension(_helper_call,"SPV_NV_shader_subgroup_partitioned");
      spv::Builder::addCapability(_helper_call,CapabilityGroupNonUniformPartitionedNV);
      pOStack_48 = Converter::Impl::allocate((Impl *)instruction_local,type_id,(Value *)builder);
      IVar3 = spv::Builder::makeUintConstant(_helper_call,3,false);
      Operation::add_id(pOStack_48,IVar3);
      Operation::add_literal(pOStack_48,8);
    }
    pCVar1 = instruction_local;
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
    Operation::add_id(pOStack_48,IVar3);
    for (is_helper_lane._4_4_ = 0; pCVar1 = instruction_local, is_helper_lane._4_4_ < 4;
        is_helper_lane._4_4_ = is_helper_lane._4_4_ + 1) {
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,is_helper_lane._4_4_ + 2);
      IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
      (&ballot_value)[is_helper_lane._4_4_] = IVar3;
    }
    IVar3 = spv::Builder::makeUintType(_helper_call,0x20);
    is_helper_lane._0_4_ = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&ballot_value,4);
    if (((ulong)instruction_local[0x19].super_Instruction.operands.
                super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
      is_helper_lane._0_4_ = emit_masked_ballot((Impl *)instruction_local,(Id)is_helper_lane);
    }
    Operation::add_id(pOStack_48,(Id)is_helper_lane);
    if ((((ulong)instruction_local[0x19].super_Instruction.operands.
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) == 0) &&
       (bVar2 = wave_op_needs_helper_lane_masking((Impl *)instruction_local),
       pCVar1 = instruction_local, bVar2)) {
      this = Converter::Impl::builder((Impl *)instruction_local);
      IVar3 = spv::Builder::makeBoolType(this);
      op_00 = Converter::Impl::allocate((Impl *)pCVar1,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add((Impl *)instruction_local,op_00,false);
      Operation::add_id(pOStack_48,op_00->id);
    }
    Converter::Impl::add((Impl *)instruction_local,pOStack_48,false);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_wave_multi_prefix_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 6, &op_kind))
		return false;

	HelperCall helper_call;
	spv::Op partitioned_op;
	bool fp = !instruction->getOperand(1)->getType()->isIntegerTy();

	switch (static_cast<DXIL::WaveMultiPrefixOpKind>(op_kind))
	{
	case DXIL::WaveMultiPrefixOpKind::Sum:
		helper_call = fp ? HelperCall::WaveMultiPrefixFAdd : HelperCall::WaveMultiPrefixIAdd;
		partitioned_op = fp ? spv::OpGroupNonUniformFAdd : spv::OpGroupNonUniformIAdd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Product:
		helper_call = fp ? HelperCall::WaveMultiPrefixFMul : HelperCall::WaveMultiPrefixIMul;
		partitioned_op = fp ? spv::OpGroupNonUniformFMul : spv::OpGroupNonUniformIMul;
		break;

	case DXIL::WaveMultiPrefixOpKind::And:
		helper_call = HelperCall::WaveMultiPrefixBitAnd;
		partitioned_op = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveMultiPrefixOpKind::Or:
		helper_call = HelperCall::WaveMultiPrefixBitOr;
		partitioned_op = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveMultiPrefixOpKind::Xor:
		helper_call = HelperCall::WaveMultiPrefixBitXor;
		partitioned_op = spv::OpGroupNonUniformBitwiseXor;
		break;

	default:
		return false;
	}

	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());

	Operation *op;

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		op = impl.allocate(partitioned_op, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_literal(spv::GroupOperationPartitionedExclusiveScanNV);
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call, type_id);
		op = impl.allocate(spv::OpFunctionCall, instruction);
		op->add_id(call_id);
	}

	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

	spv::Id ballot[4];
	for (unsigned i = 0; i < 4; i++)
		ballot[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id ballot_value = impl.build_vector(builder.makeUintType(32), ballot, 4);

	// Have to explicitly ignore inactive lanes here to make sure that lanes in the same partition have equal
	// partition values.
	if (impl.options.nv_subgroup_partition_enabled)
		ballot_value = emit_masked_ballot(impl, ballot_value);

	op->add_id(ballot_value);

	if (!impl.options.nv_subgroup_partition_enabled &&
	    wave_op_needs_helper_lane_masking(impl))
	{
		auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
		impl.add(is_helper_lane);
		op->add_id(is_helper_lane->id);
	}

	impl.add(op);

	return true;
}